

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void * mi_expand(void *p,size_t newsize)

{
  size_t sVar1;
  ulong in_RSI;
  char *in_RDI;
  size_t size;
  void *in_stack_fffffffffffffff8;
  
  if (in_RDI == (char *)0x0) {
    in_RDI = (char *)0x0;
  }
  else {
    sVar1 = _mi_usable_size(in_stack_fffffffffffffff8,in_RDI);
    if (sVar1 < in_RSI) {
      in_RDI = (char *)0x0;
    }
  }
  return in_RDI;
}

Assistant:

void* mi_expand(void* p, size_t newsize) mi_attr_noexcept {
  #if MI_PADDING
  // we do not shrink/expand with padding enabled
  MI_UNUSED(p); MI_UNUSED(newsize);
  return NULL;
  #else
  if (p == NULL) return NULL;
  const size_t size = _mi_usable_size(p,"mi_expand");
  if (newsize > size) return NULL;
  return p; // it fits
  #endif
}